

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O2

void __thiscall
btMultiBodyDynamicsWorld::integrateTransforms(btMultiBodyDynamicsWorld *this,btScalar timeStep)

{
  uint uVar1;
  int iVar2;
  btMultiBody *this_00;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int b;
  long lVar6;
  bool bVar7;
  CProfileSample __profile;
  btAlignedObjectArray<btQuaternion> world_to_local;
  btAlignedObjectArray<btVector3> local_origin;
  CProfileSample local_8d;
  btScalar local_8c;
  btMultiBodyDynamicsWorld *local_88;
  btAlignedObjectArray<btQuaternion> local_80;
  btAlignedObjectArray<btVector3> local_60;
  btVector3 local_40;
  
  local_8c = timeStep;
  local_88 = this;
  btDiscreteDynamicsWorld::integrateTransforms(&this->super_btDiscreteDynamicsWorld,timeStep);
  CProfileManager::Start_Profile("btMultiBody stepPositions");
  local_80.m_ownsMemory = true;
  local_80.m_data = (btQuaternion *)0x0;
  local_80.m_size = 0;
  local_80.m_capacity = 0;
  local_60.m_ownsMemory = true;
  local_60.m_data = (btVector3 *)0x0;
  local_60.m_size = 0;
  local_60.m_capacity = 0;
  for (lVar6 = 0; lVar6 < (local_88->m_multiBodies).m_size; lVar6 = lVar6 + 1) {
    this_00 = (local_88->m_multiBodies).m_data[lVar6];
    if (this_00->m_baseCollider == (btMultiBodyLinkCollider *)0x0) {
      bVar7 = false;
    }
    else {
      bVar7 = *(int *)(this_00->m_baseCollider + 0xec) == 2;
    }
    uVar1 = (this_00->m_links).m_size;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (lVar5 = 0; uVar4 * 600 - lVar5 != 0; lVar5 = lVar5 + 600) {
      lVar3 = *(long *)((long)((this_00->m_links).m_data)->m_jointTorque + lVar5 + 0x1c);
      if (lVar3 != 0) {
        bVar7 = (bool)(bVar7 | *(int *)(lVar3 + 0xec) == 2);
      }
    }
    if (bVar7) {
      btMultiBody::clearVelocities(this_00);
    }
    else {
      if (this_00->__posUpdated == false) {
        btMultiBody::stepPositionsMultiDof(this_00,local_8c,(btScalar *)0x0,(btScalar *)0x0);
      }
      else {
        iVar2 = this_00->m_dofCount;
        btMultiBody::stepPositionsMultiDof
                  (this_00,1.0,(btScalar *)0x0,
                   (this_00->m_realBuf).m_data + (iVar2 + iVar2 * iVar2 + 6));
        this_00->__posUpdated = false;
      }
      btAlignedObjectArray<btQuaternion>::resize(&local_80,uVar1 + 1,(btQuaternion *)&local_40);
      btAlignedObjectArray<btVector3>::resize(&local_60,uVar1 + 1,&local_40);
      btMultiBody::updateCollisionObjectWorldTransforms(this_00,&local_80,&local_60);
    }
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_60);
  btAlignedObjectArray<btQuaternion>::~btAlignedObjectArray(&local_80);
  CProfileSample::~CProfileSample(&local_8d);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::integrateTransforms(btScalar timeStep)
{
	btDiscreteDynamicsWorld::integrateTransforms(timeStep);

	{
		BT_PROFILE("btMultiBody stepPositions");
		//integrate and update the Featherstone hierarchies
		btAlignedObjectArray<btQuaternion> world_to_local;
		btAlignedObjectArray<btVector3> local_origin;

		for (int b=0;b<m_multiBodies.size();b++)
		{
			btMultiBody* bod = m_multiBodies[b];
			bool isSleeping = false;
			if (bod->getBaseCollider() && bod->getBaseCollider()->getActivationState() == ISLAND_SLEEPING)
			{
				isSleeping = true;
			} 
			for (int b=0;b<bod->getNumLinks();b++)
			{
				if (bod->getLink(b).m_collider && bod->getLink(b).m_collider->getActivationState()==ISLAND_SLEEPING)
					isSleeping = true;
			}


			if (!isSleeping)
			{
				int nLinks = bod->getNumLinks();

				///base + num m_links
			
				
				{
					if(!bod->isPosUpdated())
						bod->stepPositionsMultiDof(timeStep);
					else
					{
						btScalar *pRealBuf = const_cast<btScalar *>(bod->getVelocityVector());
						pRealBuf += 6 + bod->getNumDofs() + bod->getNumDofs()*bod->getNumDofs();

						bod->stepPositionsMultiDof(1, 0, pRealBuf);
						bod->setPosUpdated(false);
					}
				}
				
				world_to_local.resize(nLinks+1);
				local_origin.resize(nLinks+1);

				bod->updateCollisionObjectWorldTransforms(world_to_local,local_origin);
				
			} else
			{
				bod->clearVelocities();
			}
		}
	}
}